

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

State * __thiscall
despot::BaseTag::GetMMAP
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Coord opp;
  Coord rob;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = MostLikelyRobPosition(this,particles);
  local_38 = MostLikelyOpponentPosition(this,particles);
  iVar1 = Floor::GetIndex(&this->floor_,(Coord *)&local_30);
  iVar2 = Floor::GetIndex(&this->floor_,(Coord *)&local_38);
  iVar3 = despot::Floor::NumCells();
  return &(this->states_).
          super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3 * iVar1 + iVar2]->super_State;
}

Assistant:

const State* BaseTag::GetMMAP(const vector<State*>& particles) const {
	Coord rob = MostLikelyRobPosition(particles);
	Coord opp = MostLikelyOpponentPosition(particles);

	int state_id = RobOppIndicesToStateIndex(floor_.GetIndex(rob),
		floor_.GetIndex(opp));
	return states_[state_id];
}